

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stop_Freeze_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Stop_Freeze_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Stop_Freeze_PDU *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KString local_270;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Stop_Freeze_PDU *local_18;
  Stop_Freeze_PDU *this_local;
  
  local_18 = this;
  this_local = (Stop_Freeze_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"-Stop/Freeze PDU-\n");
  Simulation_Management_Header::GetAsString_abi_cxx11_
            (&local_1f0,&this->super_Simulation_Management_Header);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"Real World Time:\n");
  DATA_TYPE::ClockTime::GetAsString_abi_cxx11_(&local_230,&this->m_RealWorldTime);
  UTILS::IndentString(&local_210,&local_230,1,'\t');
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1,"\tReason:           ");
  DATA_TYPE::ENUMS::GetEnumAsStringStopFreezeReason_abi_cxx11_
            (&local_250,(ENUMS *)(ulong)this->m_ui8Reason,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_250);
  poVar1 = std::operator<<(poVar1,"\n\tFrozen Behavior:  ");
  DATA_TYPE::ENUMS::GetEnumAsStringFrozenBehavior_abi_cxx11_
            (&local_270,(ENUMS *)(ulong)this->m_ui8FrozenBehaviour,Value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_270);
  poVar1 = std::operator<<(poVar1,"\n\tRequest ID:       ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui32RequestID);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Stop_Freeze_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Stop/Freeze PDU-\n"
       << Simulation_Management_Header::GetAsString()
       << "Real World Time:\n"
       << IndentString( m_RealWorldTime.GetAsString(), 1 )
       << "\tReason:           "   << GetEnumAsStringStopFreezeReason( m_ui8Reason )
       << "\n\tFrozen Behavior:  " << GetEnumAsStringFrozenBehavior( m_ui8FrozenBehaviour )
       << "\n\tRequest ID:       " << m_ui32RequestID
       << "\n";

    return ss.str();
}